

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluGLContextFactory.cpp
# Opt level: O2

RenderContext * __thiscall
eglu::GLContextFactory::createContext
          (GLContextFactory *this,RenderConfig *config,CommandLine *cmdLine)

{
  Functions *this_00;
  SurfaceType SVar1;
  NativeDisplay *nativeDisplay;
  _func_int **pp_Var2;
  _func_int **pp_Var3;
  _func_int **pp_Var4;
  _func_int **pp_Var5;
  bool bVar6;
  int iVar7;
  deUint32 dVar8;
  uint uVar9;
  uint uVar10;
  NativeDisplayFactory *factory;
  NativeWindowFactory *windowFactory;
  NativePixmapFactory *pNVar11;
  RenderContext *pRVar12;
  undefined4 extraout_var;
  _func_int **pp_Var13;
  Library *egl;
  NativePixmap *pixmap;
  undefined4 extraout_var_00;
  DynamicLibrary *this_01;
  NotSupportedError *this_02;
  InternalError *this_03;
  char *fileName;
  WindowSurfacePair WVar14;
  EGLint minor;
  uint uStack_84;
  undefined8 uStack_80;
  EGLint major;
  uint uStack_74;
  undefined8 uStack_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  int local_58;
  EGLint numSamples;
  EGLint stencilBits;
  EGLint depthBits;
  EGLint height;
  EGLint width;
  _func_int **local_40;
  RenderTarget *local_38;
  
  factory = selectNativeDisplayFactory(this->m_displayFactoryRegistry,cmdLine);
  windowFactory = selectNativeWindowFactory(factory,cmdLine);
  pNVar11 = selectNativePixmapFactory(factory,cmdLine);
  pRVar12 = (RenderContext *)operator_new(0x1ad8);
  pRVar12->_vptr_RenderContext = (_func_int **)&PTR__RenderContext_01e11158;
  pp_Var13 = *(_func_int ***)&config->height;
  pp_Var2 = *(_func_int ***)&config->windowVisibility;
  pp_Var3 = *(_func_int ***)&config->redBits;
  pp_Var4 = *(_func_int ***)&config->blueBits;
  pp_Var5 = *(_func_int ***)&config->depthBits;
  pRVar12[1]._vptr_RenderContext = *(_func_int ***)config;
  pRVar12[2]._vptr_RenderContext = pp_Var13;
  pRVar12[3]._vptr_RenderContext = pp_Var2;
  pRVar12[4]._vptr_RenderContext = pp_Var3;
  pRVar12[5]._vptr_RenderContext = pp_Var4;
  pRVar12[6]._vptr_RenderContext = pp_Var5;
  pRVar12[7]._vptr_RenderContext = *(_func_int ***)&config->numSamples;
  pRVar12[8]._vptr_RenderContext = (_func_int **)windowFactory;
  local_38 = (RenderTarget *)(pRVar12 + 0x10);
  pRVar12[0xb]._vptr_RenderContext = (_func_int **)0x0;
  pRVar12[0xc]._vptr_RenderContext = (_func_int **)0x0;
  pRVar12[9]._vptr_RenderContext = (_func_int **)0x0;
  pRVar12[10]._vptr_RenderContext = (_func_int **)0x0;
  pRVar12[0xe]._vptr_RenderContext = (_func_int **)0x0;
  pRVar12[0xf]._vptr_RenderContext = (_func_int **)0x0;
  tcu::RenderTarget::RenderTarget(local_38);
  pRVar12[0x15]._vptr_RenderContext = (_func_int **)0x0;
  this_00 = (Functions *)(pRVar12 + 0x16);
  glw::Functions::Functions(this_00);
  SVar1 = config->surfaceType;
  iVar7 = (*(factory->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[3])(factory,0);
  pRVar12[9]._vptr_RenderContext = (_func_int **)CONCAT44(extraout_var,iVar7);
  pp_Var13 = (_func_int **)getDisplay((NativeDisplay *)CONCAT44(extraout_var,iVar7));
  pRVar12[0xc]._vptr_RenderContext = pp_Var13;
  egl = (Library *)(**(code **)(*pRVar12[9]._vptr_RenderContext + 0x10))();
  _major = (undefined **)((ulong)uStack_74 << 0x20);
  _minor = (ulong)uStack_84 << 0x20;
  (*egl->_vptr_Library[0x25])(egl,pRVar12[0xc]._vptr_RenderContext);
  dVar8 = (*egl->_vptr_Library[0x1f])(egl);
  checkError(dVar8,"initialize(m_eglDisplay, &major, &minor)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLContextFactory.cpp"
             ,0x142);
  pp_Var13 = (_func_int **)chooseConfig(egl,pRVar12[0xc]._vptr_RenderContext,config);
  pRVar12[0xd]._vptr_RenderContext = pp_Var13;
  switch(SVar1) {
  case SURFACETYPE_DONT_CARE:
    uVar9 = getConfigAttribInt(egl,pRVar12[0xc]._vptr_RenderContext,pp_Var13,0x3033);
    if ((uVar9 & 4) != 0) goto switchD_00e260d2_caseD_1;
    if ((uVar9 & 1) != 0) {
      pp_Var13 = pRVar12[0xd]._vptr_RenderContext;
      goto switchD_00e260d2_caseD_3;
    }
    if ((uVar9 & 2) == 0) {
      this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_02,"Selected EGL config doesn\'t support any surface types",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLContextFactory.cpp"
                 ,0x153);
      goto LAB_00e26572;
    }
  case SURFACETYPE_OFFSCREEN_NATIVE:
    if (pNVar11 == (NativePixmapFactory *)0x0) {
      this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_02,"EGL platform doesn\'t support pixmaps",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLContextFactory.cpp"
                 ,0x16e);
LAB_00e26572:
      __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    nativeDisplay = (NativeDisplay *)pRVar12[9]._vptr_RenderContext;
    local_40 = pRVar12[0xc]._vptr_RenderContext;
    pp_Var13 = pRVar12[0xd]._vptr_RenderContext;
    _major = (undefined **)0x3038;
    pixmap = (NativePixmap *)(**(code **)(*(long *)pNVar11 + 0x20))(pNVar11,nativeDisplay);
    pp_Var13 = (_func_int **)
               createPixmapSurface(nativeDisplay,pixmap,local_40,pp_Var13,(EGLAttrib *)&major);
    pRVar12[0xb]._vptr_RenderContext = (_func_int **)pixmap;
    break;
  case SURFACETYPE_WINDOW:
switchD_00e260d2_caseD_1:
    if (windowFactory == (NativeWindowFactory *)0x0) {
      this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_02,"EGL platform doesn\'t support windows",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLContextFactory.cpp"
                 ,0x161);
      goto LAB_00e26572;
    }
    WVar14 = anon_unknown_1::createWindow
                       ((NativeDisplay *)pRVar12[9]._vptr_RenderContext,windowFactory,
                        pRVar12[0xc]._vptr_RenderContext,pRVar12[0xd]._vptr_RenderContext,config);
    pp_Var13 = (_func_int **)WVar14.second;
    pRVar12[10]._vptr_RenderContext = (_func_int **)WVar14.first;
    break;
  case SURFACETYPE_OFFSCREEN_GENERIC:
switchD_00e260d2_caseD_3:
    uStack_74 = config->width;
    if (config->width == -1) {
      uStack_74 = 0x200;
    }
    iVar7 = config->height;
    if (config->height == -1) {
      iVar7 = 0x200;
    }
    major = 0x3057;
    uStack_70 = (Library *)CONCAT44(iVar7,0x3056);
    local_68._M_allocated_capacity._0_4_ = 0x3038;
    iVar7 = (*egl->_vptr_Library[10])(egl,pRVar12[0xc]._vptr_RenderContext,pp_Var13);
    pp_Var13 = (_func_int **)CONCAT44(extraout_var_00,iVar7);
    dVar8 = (*egl->_vptr_Library[0x1f])(egl);
    checkError(dVar8,"eglCreatePbufferSurface()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLContextFactory.cpp"
               ,0x123);
    break;
  default:
    this_03 = (InternalError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&major,"Invalid surface type",(allocator<char> *)&minor);
    tcu::InternalError::InternalError(this_03,(string *)&major);
    __cxa_throw(this_03,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
  }
  pRVar12[0xe]._vptr_RenderContext = pp_Var13;
  pp_Var13 = (_func_int **)
             createGLContext(egl,pRVar12[0xc]._vptr_RenderContext,pRVar12[0xd]._vptr_RenderContext,
                             &config->type,config->resetNotificationStrategy);
  pRVar12[0xf]._vptr_RenderContext = pp_Var13;
  (*egl->_vptr_Library[0x27])
            (egl,pRVar12[0xc]._vptr_RenderContext,pRVar12[0xe]._vptr_RenderContext,
             pRVar12[0xe]._vptr_RenderContext,pp_Var13);
  dVar8 = (*egl->_vptr_Library[0x1f])(egl);
  checkError(dVar8,"makeCurrent(m_eglDisplay, m_eglSurface, m_eglSurface, m_eglContext)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLContextFactory.cpp"
             ,0x17c);
  pp_Var13 = pRVar12[0xc]._vptr_RenderContext;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&major,"EGL_KHR_get_all_proc_addresses",(allocator<char> *)&minor);
  bVar6 = hasExtension(egl,pp_Var13,(string *)&major);
  std::__cxx11::string::~string((string *)&major);
  if (bVar6) {
    _major = &PTR_get_01e111e8;
    uStack_70 = egl;
    glu::initCoreFunctions
              (this_00,(FunctionLoader *)&major,
               (ApiType)((config->type).super_ApiType.m_bits & 0x3ff));
  }
  else {
    uVar9 = (config->type).super_ApiType.m_bits;
    uVar10 = uVar9 & 0x3ff;
    if (uVar10 == 3) {
      glw::initES30Direct(this_00);
    }
    else if (uVar10 == 2) {
      glw::initES20Direct(this_00);
    }
    else {
      this_01 = (DynamicLibrary *)operator_new(8);
      fileName = "libGL.so";
      if ((uVar9 & 0x300) == 0) {
        fileName = "libGLESv2.so";
      }
      de::DynamicLibrary::DynamicLibrary(this_01,fileName);
      pRVar12[0x15]._vptr_RenderContext = (_func_int **)this_01;
      _major = &PTR_get_01e11218;
      uStack_70 = (Library *)this_01;
      glu::initCoreFunctions
                (this_00,(FunctionLoader *)&major,
                 (ApiType)((config->type).super_ApiType.m_bits & 0x3ff));
    }
  }
  _major = &PTR_get_01e111e8;
  uStack_70 = egl;
  glu::initExtensionFunctions
            (this_00,(FunctionLoader *)&major,(ApiType)((config->type).super_ApiType.m_bits & 0x3ff)
            );
  minor = 0;
  uStack_84 = 0;
  uStack_80._0_4_ = 0;
  uStack_80._4_4_ = 0;
  (*egl->_vptr_Library[0x2b])
            (egl,pRVar12[0xc]._vptr_RenderContext,pRVar12[0xe]._vptr_RenderContext,0x3057,&width);
  (*egl->_vptr_Library[0x2b])
            (egl,pRVar12[0xc]._vptr_RenderContext,pRVar12[0xe]._vptr_RenderContext,0x3056,&height);
  (*egl->_vptr_Library[0x19])
            (egl,pRVar12[0xc]._vptr_RenderContext,pRVar12[0xd]._vptr_RenderContext,0x3024,&minor);
  (*egl->_vptr_Library[0x19])
            (egl,pRVar12[0xc]._vptr_RenderContext,pRVar12[0xd]._vptr_RenderContext,0x3023,&uStack_84
            );
  (*egl->_vptr_Library[0x19])
            (egl,pRVar12[0xc]._vptr_RenderContext,pRVar12[0xd]._vptr_RenderContext,0x3022,&uStack_80
            );
  (*egl->_vptr_Library[0x19])
            (egl,pRVar12[0xc]._vptr_RenderContext,pRVar12[0xd]._vptr_RenderContext,0x3021,
             (long)&uStack_80 + 4);
  (*egl->_vptr_Library[0x19])
            (egl,pRVar12[0xc]._vptr_RenderContext,pRVar12[0xd]._vptr_RenderContext,0x3025,&depthBits
            );
  (*egl->_vptr_Library[0x19])
            (egl,pRVar12[0xc]._vptr_RenderContext,pRVar12[0xd]._vptr_RenderContext,0x3026,
             &stencilBits);
  (*egl->_vptr_Library[0x19])
            (egl,pRVar12[0xc]._vptr_RenderContext,pRVar12[0xd]._vptr_RenderContext,0x3031,
             &numSamples);
  dVar8 = (*egl->_vptr_Library[0x1f])(egl);
  checkError(dVar8,"Failed to query config attributes",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLContextFactory.cpp"
             ,0x1c8);
  tcu::RenderTarget::RenderTarget
            ((RenderTarget *)&major,width,height,(PixelFormat *)&minor,depthBits,stencilBits,
             numSamples);
  local_38->m_numSamples = local_58;
  (local_38->m_pixelFormat).blueBits = local_68._0_4_;
  (local_38->m_pixelFormat).alphaBits = local_68._4_4_;
  local_38->m_depthBits = local_68._8_4_;
  local_38->m_stencilBits = local_68._12_4_;
  *(undefined ***)local_38 = _major;
  *(Library **)&local_38->m_pixelFormat = uStack_70;
  return pRVar12;
}

Assistant:

glu::RenderContext* GLContextFactory::createContext (const glu::RenderConfig& config, const tcu::CommandLine& cmdLine) const
{
	const NativeDisplayFactory& displayFactory = selectNativeDisplayFactory(m_displayFactoryRegistry, cmdLine);

	const NativeWindowFactory*	windowFactory;
	const NativePixmapFactory*	pixmapFactory;

	try
	{
		windowFactory = &selectNativeWindowFactory(displayFactory, cmdLine);
	}
	catch (const tcu::NotSupportedError&)
	{
		windowFactory = DE_NULL;
	}

	try
	{
		pixmapFactory = &selectNativePixmapFactory(displayFactory, cmdLine);
	}
	catch (const tcu::NotSupportedError&)
	{
		pixmapFactory = DE_NULL;
	}

	return new RenderContext(&displayFactory, windowFactory, pixmapFactory, config);
}